

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void XYcZ_initial_double(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *X2,uECC_word_t *Y2,
                        uECC_word_t *initial_Z,uECC_Curve curve)

{
  wordcount_t num_words_00;
  uECC_word_t uStack_58;
  wordcount_t num_words;
  uECC_word_t z [4];
  uECC_Curve curve_local;
  uECC_word_t *initial_Z_local;
  uECC_word_t *Y2_local;
  uECC_word_t *X2_local;
  uECC_word_t *Y1_local;
  uECC_word_t *X1_local;
  
  num_words_00 = curve->num_words;
  z[3] = (uECC_word_t)curve;
  if (initial_Z == (uECC_word_t *)0x0) {
    uECC_vli_clear(&stack0xffffffffffffffa8,num_words_00);
    uStack_58 = 1;
  }
  else {
    uECC_vli_set(&stack0xffffffffffffffa8,initial_Z,num_words_00);
  }
  uECC_vli_set(X2,X1,num_words_00);
  uECC_vli_set(Y2,Y1,num_words_00);
  apply_z(X1,Y1,&stack0xffffffffffffffa8,(uECC_Curve)z[3]);
  (**(code **)(z[3] + 0xa8))(X1,Y1,&stack0xffffffffffffffa8,z[3]);
  apply_z(X2,Y2,&stack0xffffffffffffffa8,(uECC_Curve)z[3]);
  return;
}

Assistant:

static void XYcZ_initial_double(uECC_word_t * X1,
                                uECC_word_t * Y1,
                                uECC_word_t * X2,
                                uECC_word_t * Y2,
                                const uECC_word_t * const initial_Z,
                                uECC_Curve curve) {
    uECC_word_t z[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;
    if (initial_Z) {
        uECC_vli_set(z, initial_Z, num_words);
    } else {
        uECC_vli_clear(z, num_words);
        z[0] = 1;
    }

    uECC_vli_set(X2, X1, num_words);
    uECC_vli_set(Y2, Y1, num_words);

    apply_z(X1, Y1, z, curve);
    curve->double_jacobian(X1, Y1, z, curve);
    apply_z(X2, Y2, z, curve);
}